

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

mraa_result_t
mraa_gpio_isr(mraa_gpio_context dev,mraa_gpio_edge_t mode,_func_void_void_ptr *fptr,void *args)

{
  _func_mraa_result_t_mraa_gpio_context_mraa_gpio_edge_t__func_void_void_ptr_ptr_void_ptr
  *UNRECOVERED_JUMPTABLE;
  mraa_result_t mVar1;
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"gpio: isr: context is invalid");
    mVar1 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
       (UNRECOVERED_JUMPTABLE = dev->advance_func->gpio_isr_replace,
       UNRECOVERED_JUMPTABLE !=
       (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_edge_t__func_void_void_ptr_ptr_void_ptr *)
       0x0)) {
      mVar1 = (*UNRECOVERED_JUMPTABLE)(dev,mode,fptr,args);
      return mVar1;
    }
    if (dev->thread_id == 0) {
      mVar1 = mraa_gpio_edge_mode(dev,mode);
      if (mVar1 == MRAA_SUCCESS) {
        dev->isr = fptr;
        if ((lang_func->java_create_global_ref != (_func_void_ptr_void_ptr *)0x0) &&
           (lang_func->java_isr_callback == fptr)) {
          args = (*lang_func->java_create_global_ref)(args);
        }
        dev->isr_args = args;
        mVar1 = MRAA_SUCCESS;
        pthread_create(&dev->thread_id,(pthread_attr_t *)0x0,mraa_gpio_interrupt_handler,dev);
      }
    }
    else {
      mVar1 = MRAA_ERROR_NO_RESOURCES;
    }
  }
  return mVar1;
}

Assistant:

mraa_result_t
mraa_gpio_isr(mraa_gpio_context dev, mraa_gpio_edge_t mode, void (*fptr)(void*), void* args)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "gpio: isr: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, gpio_isr_replace)) {
        return dev->advance_func->gpio_isr_replace(dev, mode, fptr, args);
    }

    // we only allow one isr per mraa_gpio_context
    if (dev->thread_id != 0) {
        return MRAA_ERROR_NO_RESOURCES;
    }

    mraa_result_t ret;


    ret = mraa_gpio_edge_mode(dev, mode);

    if (ret != MRAA_SUCCESS) {
        return ret;
    }

    dev->isr = fptr;

    /* Most UPM sensors use the C API, the Java global ref must be created here. */
    /* The reason for checking the callback function is internal callbacks. */
    if (lang_func->java_create_global_ref != NULL) {
        if (dev->isr == lang_func->java_isr_callback) {
            args = lang_func->java_create_global_ref(args);
        }
    }

    dev->isr_args = args;

    pthread_create(&dev->thread_id, NULL, mraa_gpio_interrupt_handler, (void*) dev);

    return MRAA_SUCCESS;
}